

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureGlyphCache::fillTexture
          (QOpenGLTextureGlyphCache *this,Coord *c,glyph_t glyph,QFixedPoint *subPixelPosition)

{
  long lVar1;
  QOpenGLContext *ctx_00;
  QOpenGLContextPrivate *pQVar2;
  uint in_EDX;
  int *in_RSI;
  Coord *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000014;
  int in_stack_00000018;
  GLuint in_stack_0000001c;
  QImage *in_stack_00000020;
  QOpenGLContext *in_stack_00000028;
  QOpenGLContext *ctx;
  QImage mask;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QImage *in_stack_ffffffffffffff80;
  undefined8 local_40;
  undefined8 local_38;
  GLuint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ctx_00 = (QOpenGLContext *)QOpenGLContext::currentContext();
  if (ctx_00 == (QOpenGLContext *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,
               "QOpenGLTextureGlyphCache::fillTexture: Called with no context");
  }
  else {
    pQVar2 = QOpenGLContext::d_func((QOpenGLContext *)0x1a48c0);
    if (((byte)pQVar2[0xfc] & 1) == 0) {
      local_40 = 0xaaaaaaaaaaaaaaaa;
      local_38 = 0xaaaaaaaaaaaaaaaa;
      QTextureGlyphCache::textureMapForGlyph((uint)&local_40,(QFixedPoint *)in_RDI);
      load_glyph_image_to_texture
                (in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                 in_stack_00000014);
      QImage::~QImage((QImage *)&local_40);
    }
    else {
      QImageTextureGlyphCache::fillTexture(in_RDI,(uint)in_RSI,(QFixedPoint *)(ulong)in_EDX);
      QImageTextureGlyphCache::image((QImageTextureGlyphCache *)in_RDI);
      load_glyph_image_region_to_texture
                (ctx_00,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_RSI[1],
                 in_stack_ffffffffffffff74,*in_RSI,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureGlyphCache::fillTexture(const Coord &c,
                                           glyph_t glyph,
                                           const QFixedPoint &subPixelPosition)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx == nullptr) {
        qWarning("QOpenGLTextureGlyphCache::fillTexture: Called with no context");
        return;
    }

    if (ctx->d_func()->workaround_brokenFBOReadBack) {
        QImageTextureGlyphCache::fillTexture(c, glyph, subPixelPosition);
        load_glyph_image_region_to_texture(ctx, image(), c.x, c.y, c.w, c.h, m_textureResource->m_texture, c.x, c.y);
        return;
    }

    QImage mask = textureMapForGlyph(glyph, subPixelPosition);
    load_glyph_image_to_texture(ctx, mask, m_textureResource->m_texture, c.x, c.y);
}